

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3.hpp
# Opt level: O1

bool jsoncons::detail::grisu3(double v,char *buffer,int *length,int *K)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  diy_fp_t Wm;
  diy_fp_t W;
  diy_fp_t Wp;
  
  uVar11 = (ulong)v & 0xfffffffffffff;
  uVar13 = (uint)((ulong)v >> 0x34) & 0x7ff;
  uVar5 = uVar11 | 0x10000000000000;
  if (uVar13 == 0) {
    uVar5 = uVar11;
  }
  iVar4 = -0x432;
  if (uVar13 != 0) {
    iVar4 = uVar13 - 0x433;
  }
  iVar3 = iVar4 + -1;
  uVar14 = uVar5 * 2 + 1;
  iVar15 = iVar3;
  if (uVar13 == 0) {
    lVar8 = 0x3f;
    if ((uVar14 & 0x1fffffffffffff) != 0) {
      for (; (uVar14 & 0x1fffffffffffff) >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    uVar14 = uVar14 << (~(byte)lVar8 + 0x36 & 0x3f);
    iVar15 = (iVar4 - ((uint)lVar8 ^ 0x3f)) + 9;
  }
  uVar16 = uVar5;
  iVar6 = iVar4;
  if (uVar13 == 0) {
    lVar8 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    uVar16 = uVar5 << (~(byte)lVar8 + 0x35 & 0x3f);
    iVar6 = (iVar4 - ((uint)lVar8 ^ 0x3f)) + 0xb;
  }
  lVar8 = uVar5 * 2 + -1;
  if (uVar5 == 0x10000000000000) {
    iVar3 = iVar4 + -2;
    lVar8 = 0x3fffffffffffff;
  }
  uVar7 = lVar8 << (((char)iVar3 - (char)iVar15) + 10U & 0x3f);
  dVar1 = ceil((double)(-0x32 - iVar15) * 0.30102999566398114);
  iVar4 = (int)dVar1;
  uVar5 = (uVar16 << 0xb) >> 0x20;
  uVar16 = uVar16 << 0xb & 0xffffffff;
  uVar9 = *(ulong *)(powers_ten + (long)iVar4 * 8 + 0xab8) & 0xffffffff;
  uVar12 = *(ulong *)(powers_ten + (long)iVar4 * 8 + 0xab8) >> 0x20;
  uVar10 = uVar12 * uVar16;
  uVar11 = uVar5 * uVar9;
  W.f = ((uVar10 & 0xffffffff) + (uVar11 & 0xffffffff) + (uVar16 * uVar9 >> 0x20) + 0x80000000 >>
        0x20) + (uVar10 >> 0x20) + (uVar11 >> 0x20) + uVar12 * uVar5;
  W.e = iVar6 + *(int *)(powers_ten_e + (long)iVar4 * 4 + 0x55c) + 0x35;
  uVar11 = (uVar14 << 10) >> 0x20;
  uVar5 = uVar14 << 10 & 0xffffffff;
  uVar16 = uVar12 * uVar5;
  uVar14 = uVar11 * uVar9;
  Wp.f = ((uVar16 & 0xffffffff) + (uVar14 & 0xffffffff) + (uVar5 * uVar9 >> 0x20) + 0x80000000 >>
         0x20) + (uVar16 >> 0x20) + (uVar14 >> 0x20) + uVar12 * uVar11;
  Wm.e = *(int *)(powers_ten_e + (long)iVar4 * 4 + 0x55c) + iVar15 + 0x36;
  uVar11 = uVar7 >> 0x20;
  uVar7 = uVar7 & 0xffffffff;
  uVar5 = uVar12 * uVar7;
  uVar14 = uVar11 * uVar9;
  Wm.f = ((uVar5 & 0xffffffff) + (uVar14 & 0xffffffff) + (uVar9 * uVar7 >> 0x20) + 0x80000000 >>
         0x20) + (uVar5 >> 0x20) + (uVar14 >> 0x20) + uVar12 * uVar11;
  *K = -iVar4;
  Wm._12_4_ = 0;
  W._12_4_ = 0;
  Wp.e = Wm.e;
  Wp._12_4_ = 0;
  bVar2 = digit_gen(Wm,W,Wp,buffer,length,K);
  buffer[*length] = '\0';
  return bVar2;
}

Assistant:

inline
bool grisu3(double v, char *buffer, int *length, int *K)
{
    diy_fp_t w_m, w_p;
    int q = 64, alpha = -59, gamma = -56;
    normalized_boundaries(v, &w_m, &w_p);
    diy_fp_t w = normalize_diy_fp(double2diy_fp(v));
    int mk = k_comp(w_p.e + q, alpha, gamma);
    diy_fp_t c_mk = cached_power(mk);
    diy_fp_t W  = multiply(w,   c_mk);
    diy_fp_t Wp = multiply(w_p, c_mk);
    diy_fp_t Wm = multiply(w_m, c_mk);
    *K = -mk;
    bool result = digit_gen(Wm, W, Wp, buffer, length, K);
    buffer[*length] = 0;
    return result;
}